

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.hpp
# Opt level: O3

void editFile(string *path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::operator+(&local_28,"vim ",path);
  system(local_28._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return;
}

Assistant:

void editFile(std::string path) {
    system(("vim " + path).c_str());
}